

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdPath.c
# Opt level: O0

int Sbc_ManAddInternalToPath_rec(Gia_Man_t *p,int iObj,Vec_Bit_t *vPath)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pObj_00;
  int *piVar3;
  uint local_3c;
  int Value;
  int iFan;
  int k;
  Gia_Obj_t *pObj;
  Vec_Bit_t *vPath_local;
  int iObj_local;
  Gia_Man_t *p_local;
  
  local_3c = 0;
  iVar1 = Gia_ObjIsTravIdCurrentId(p,iObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrentId(p,iObj);
    pObj_00 = Gia_ManObj(p,iObj);
    iVar1 = Gia_ObjIsCi(pObj_00);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsAnd(pObj_00);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdPath.c"
                      ,0x38,"int Sbc_ManAddInternalToPath_rec(Gia_Man_t *, int, Vec_Bit_t *)");
      }
      for (Value = 0; iVar1 = Gia_ObjLutSize(p,iObj), Value < iVar1; Value = Value + 1) {
        piVar3 = Gia_ObjLutFanins(p,iObj);
        uVar2 = Sbc_ManAddInternalToPath_rec(p,piVar3[Value],vPath);
        local_3c = uVar2 | local_3c;
      }
      if (local_3c != 0) {
        Vec_BitWriteEntry(vPath,iObj,1);
      }
      p_local._4_4_ = local_3c;
    }
    else {
      p_local._4_4_ = Vec_BitEntry(vPath,iObj);
    }
  }
  else {
    p_local._4_4_ = Vec_BitEntry(vPath,iObj);
  }
  return p_local._4_4_;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Sbc_ManAddInternalToPath_rec( Gia_Man_t * p, int iObj, Vec_Bit_t * vPath )
{
    Gia_Obj_t * pObj; 
    int k, iFan, Value = 0;
    if ( Gia_ObjIsTravIdCurrentId(p, iObj) )
        return Vec_BitEntry(vPath, iObj);
    Gia_ObjSetTravIdCurrentId(p, iObj);
    pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsCi(pObj) )
        return Vec_BitEntry(vPath, iObj);
    assert( Gia_ObjIsAnd(pObj) );
    Gia_LutForEachFanin( p, iObj, iFan, k )
        Value |= Sbc_ManAddInternalToPath_rec( p, iFan, vPath );
    if ( Value )
        Vec_BitWriteEntry( vPath, iObj, 1 );
    return Value;
}